

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ServerService.cpp
# Opt level: O2

bool __thiscall ServerService::startService(ServerService *this)

{
  _Alloc_hider data;
  uint __fd;
  int socketFD;
  ServerSegment *pSVar1;
  ostream *poVar2;
  long lVar3;
  sockaddr_storage *psVar4;
  ServerService *this_00;
  undefined8 *puVar5;
  bool bVar6;
  int iVar7;
  bool bVar8;
  byte bVar9;
  sockaddr_storage in_stack_fffffffffffff8b8;
  socklen_t clientLength;
  string key;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_698;
  sockaddr_storage clientDetails;
  byte buffer [1472];
  
  bVar9 = 0;
  memset(buffer,0,0x5c0);
  clientLength = 0x80;
  bVar8 = false;
LAB_00102c77:
  bVar6 = bVar8;
  __fd = ServerSocketUDP::getSocket(this->serverSocketUDP);
  this_00 = (ServerService *)(ulong)__fd;
  recvfrom(__fd,buffer,0x5c0,0,(sockaddr *)&clientDetails,&clientLength);
  pSVar1 = parseRequest(this_00,buffer);
  if ((pSVar1->data == (byte *)0x0) || (pSVar1->ackFlag != 'N')) goto LAB_00102d3c;
  std::operator<<((ostream *)&std::cout,"Received: ");
  poVar2 = std::operator<<((ostream *)&std::cout,(char *)pSVar1->data);
  std::endl<char,std::char_traits<char>>(poVar2);
  std::__cxx11::string::string((string *)&key,(char *)pSVar1->data,(allocator *)&local_698);
  std::operator+(&local_698,"I received ",&key);
  std::__cxx11::string::operator=((string *)&key,(string *)&local_698);
  std::__cxx11::string::~string((string *)&local_698);
  iVar7 = 200;
  while (data._M_p = key._M_dataplus._M_p, bVar8 = iVar7 != 0, iVar7 = iVar7 + -1, bVar8) {
    std::__cxx11::string::append((char *)&key);
  }
  socketFD = ServerSocketUDP::getSocket(this->serverSocketUDP);
  iVar7 = this->receiverWindowSize;
  psVar4 = &clientDetails;
  puVar5 = (undefined8 *)&stack0xfffffffffffff8b8;
  for (lVar3 = 0x10; lVar3 != 0; lVar3 = lVar3 + -1) {
    *puVar5 = *(undefined8 *)psVar4;
    psVar4 = (sockaddr_storage *)((long)psVar4 + (ulong)bVar9 * -0x10 + 8);
    puVar5 = puVar5 + (ulong)bVar9 * -2 + 1;
  }
  sendSegments(this,(byte *)data._M_p,socketFD,in_stack_fffffffffffff8b8,iVar7);
  std::__cxx11::string::~string((string *)&key);
  goto LAB_00102d8c;
LAB_00102d3c:
  bVar8 = false;
  if (bVar6) {
LAB_00102d8c:
    poVar2 = std::operator<<((ostream *)&std::cout,"Sent all segments. Closing server connection.");
    std::endl<char,std::char_traits<char>>(poVar2);
    bVar8 = true;
  }
  goto LAB_00102c77;
}

Assistant:

bool ServerService::startService() {

    socklen_t clientLength;
    struct sockaddr_storage clientDetails;
    byte buffer[MTU];
    bzero(buffer, MTU);
    bool flag = false;
    clientLength = sizeof(clientDetails);
    while (true) {
        recvfrom(serverSocketUDP->getSocket(), buffer, MTU, 0, (struct sockaddr *) &clientDetails, &clientLength);
        ServerSegment *segment = parseRequest(buffer);
        if (segment->data && segment->ackFlag == 'N') {
            cout << "Received: ";
            cout << (char *) segment->data << endl;
            string key = (char *) segment->data;
            key = "I received " + key;
            for (int i = 0; i < 200; ++i) {
                key += "123 hjg ghjfhdjg hj cjchjfghjcghjc   yjccgyjvghjvg jyy yjcgyj vyj";
            }
//            todo 对收到信息做处理，并响应请求
            if (sendSegments((byte *) key.c_str(), serverSocketUDP->getSocket(), clientDetails, receiverWindowSize)) {
                flag = true;
            }
        }
        if (flag) {
            cout << "Sent all segments. Closing server connection." << endl;
//            break;
        }
    }
}